

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

ActionResultHolder<cv::Mat> *
testing::internal::ActionResultHolder<cv::Mat>::
PerformDefaultAction<cv::Mat(cv::Mat,cv::Rect_<int>)>
          (FunctionMockerBase<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *func_mocker,ArgumentTuple *args,
          string *call_description)

{
  ActionResultHolder<cv::Mat> *pAVar1;
  Mat local_e8 [96];
  Mat local_88 [96];
  
  pAVar1 = (ActionResultHolder<cv::Mat> *)operator_new(0x68);
  FunctionMockerBase<cv::Mat_(cv::Mat,_cv::Rect_<int>)>::PerformDefaultAction
            ((FunctionMockerBase<cv::Mat_(cv::Mat,_cv::Rect_<int>)> *)local_88,
             (ArgumentTuple *)func_mocker,(string *)args);
  cv::Mat::Mat(local_e8,local_88);
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__ActionResultHolder_00181668;
  cv::Mat::Mat(&(pAVar1->result_).value_,local_e8);
  cv::Mat::~Mat(local_e8);
  cv::Mat::~Mat(local_88);
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMockerBase<F>* func_mocker,
      const typename Function<F>::ArgumentTuple& args,
      const string& call_description) {
    return new ActionResultHolder(Wrapper(
        func_mocker->PerformDefaultAction(args, call_description)));
  }